

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O2

bool __thiscall HawkTracer::client::TracepointMap::load_map(TracepointMap *this,string *map_file)

{
  char cVar1;
  istream *piVar2;
  mapped_type *this_00;
  string category;
  uint64_t label;
  string label_str;
  undefined1 local_278 [64];
  ifstream file;
  
  std::ifstream::ifstream((string *)&file);
  std::ifstream::open((string *)&file,(_Ios_Openmode)map_file);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    label_str._M_dataplus._M_p = (pointer)&label_str.field_2;
    label_str._M_string_length = 0;
    category._M_dataplus._M_p = (pointer)&category.field_2;
    category._M_string_length = 0;
    label_str.field_2._M_local_buf[0] = '\0';
    category.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::operator>>((istream *)&file,(string *)&category);
      piVar2 = std::operator>>(piVar2,(string *)&label_str);
      piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)piVar2);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::string::string((string *)local_278,(string *)&label_str);
      std::__cxx11::string::string((string *)(local_278 + 0x20),(string *)&category);
      this_00 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this,&label);
      MapInfo::operator=(this_00,(MapInfo *)local_278);
      MapInfo::~MapInfo((MapInfo *)local_278);
    }
    std::__cxx11::string::~string((string *)&category);
    std::__cxx11::string::~string((string *)&label_str);
  }
  std::ifstream::~ifstream(&file);
  return (bool)cVar1;
}

Assistant:

bool TracepointMap::load_map(const std::string& map_file)
{
    std::ifstream file;
    file.open(map_file);

    if (!file.is_open())
    {
        return false;
    }

    std::string label_str;
    uint64_t label;
    std::string category;
    while (file >> category >> label_str >> label)
    {
        _input_map[label] = MapInfo{ label_str, category };
    }

    return true;
}